

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsTraceExternalReference(JsRuntimeHandle runtimeHandle,JsValueRef value)

{
  anon_class_16_2_b71ddc3a fn;
  JsErrorCode JVar1;
  JsValueRef local_18;
  JsValueRef value_local;
  JsRuntimeHandle runtimeHandle_local;
  
  fn.value = &local_18;
  fn.runtimeHandle = &value_local;
  local_18 = value;
  value_local = runtimeHandle;
  JVar1 = GlobalAPIWrapper_NoRecord<JsTraceExternalReference::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsTraceExternalReference(_In_ JsRuntimeHandle runtimeHandle, _In_ JsValueRef value)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        recycler->TryExternalMarkNonInterior(value);
        return JsNoError;
    });
}